

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraSublimeTextGenerator::AppendTarget
          (cmExtraSublimeTextGenerator *this,cmGeneratedFileStream *fout,string *targetName,
          cmLocalGenerator *lg,cmGeneratorTarget *target,char *make,cmMakefile *makefile,
          char *param_7,MapSourceFileFlags *sourceFileFlags,bool firstTarget)

{
  bool bVar1;
  string *psVar2;
  reference ppcVar3;
  pointer ppVar4;
  char *pcVar5;
  size_type sVar6;
  ulong uVar7;
  ostream *poVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar9;
  allocator<char> local_3e1;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  undefined1 local_360 [8];
  string makefileName;
  value_type local_320;
  size_type local_300;
  size_type start;
  cmAlphaNum local_2c8;
  undefined1 local_298 [8];
  string workString;
  char *regexString;
  RegularExpression flagRegex;
  string includesString;
  string definesString;
  string flagsString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *flags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  _Base_ptr local_d0;
  undefined1 local_c8;
  _Self local_c0;
  _Self local_b8;
  iterator sourceFileFlagsIter;
  cmSourceFile *sourceFile;
  iterator __end2;
  iterator __begin2;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range2;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  bool firstTarget_local;
  char *make_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *lg_local;
  string *targetName_local;
  cmGeneratedFileStream *fout_local;
  cmExtraSublimeTextGenerator *this_local;
  
  sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = firstTarget;
  if (target != (cmGeneratorTarget *)0x0) {
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_BUILD_TYPE",&local_79);
    psVar2 = cmMakefile::GetSafeDefinition(makefile,&local_78);
    cmGeneratorTarget::GetSourceFiles
              (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58,psVar2);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    __end2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
    sourceFile = (cmSourceFile *)
                 std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                           ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                       *)&sourceFile), bVar1) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                ::operator*(&__end2);
      sourceFileFlagsIter._M_node = (_Base_ptr)*ppcVar3;
      psVar2 = cmSourceFile::ResolveFullPath
                         ((cmSourceFile *)sourceFileFlagsIter._M_node,(string *)0x0,(string *)0x0);
      local_b8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find(sourceFileFlags,psVar2);
      local_c0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end(sourceFileFlags);
      bVar1 = std::operator==(&local_b8,&local_c0);
      if (bVar1) {
        psVar2 = cmSourceFile::ResolveFullPath
                           ((cmSourceFile *)sourceFileFlagsIter._M_node,(string *)0x0,(string *)0x0)
        ;
        local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_128);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::
        pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                  (&local_108,psVar2,&local_128);
        pVar9 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::insert(sourceFileFlags,&local_108);
        local_d0 = (_Base_ptr)pVar9.first._M_node;
        local_c8 = pVar9.second;
        local_b8._M_node = local_d0;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~pair(&local_108);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_128);
      }
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&local_b8);
      ComputeFlagsForObject_abi_cxx11_
                ((string *)((long)&definesString.field_2 + 8),this,
                 (cmSourceFile *)sourceFileFlagsIter._M_node,lg,target);
      ComputeDefines_abi_cxx11_
                ((string *)((long)&includesString.field_2 + 8),this,
                 (cmSourceFile *)sourceFileFlagsIter._M_node,lg,target);
      ComputeIncludes_abi_cxx11_
                ((string *)&flagRegex.progsize,this,(cmSourceFile *)sourceFileFlagsIter._M_node,lg,
                 target);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&ppVar4->second);
      cmsys::RegularExpression::RegularExpression((RegularExpression *)&regexString);
      workString.field_2._8_8_ = anon_var_dwarf_10e84c3;
      cmsys::RegularExpression::compile
                ((RegularExpression *)&regexString,
                 "(^|[ ])-[DIOUWfgs][^= ]+(=\\\"[^\"]+\\\"|=[^\"][^ ]+)?");
      cmAlphaNum::cmAlphaNum(&local_2c8,(string *)((long)&definesString.field_2 + 8));
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&start," ");
      cmStrCat<std::__cxx11::string,char[2],std::__cxx11::string>
                ((string *)local_298,&local_2c8,(cmAlphaNum *)&start,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&includesString.field_2 + 8),(char (*) [2])0xd564a7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &flagRegex.progsize);
      while (bVar1 = cmsys::RegularExpression::find
                               ((RegularExpression *)&regexString,(string *)local_298), bVar1) {
        local_300 = cmsys::RegularExpression::start((RegularExpression *)&regexString);
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_298);
        if (*pcVar5 == ' ') {
          local_300 = local_300 + 1;
        }
        cmsys::RegularExpression::end((RegularExpression *)&regexString);
        std::__cxx11::string::substr((ulong)&local_320,(ulong)local_298);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&ppVar4->second,&local_320);
        std::__cxx11::string::~string((string *)&local_320);
        sVar6 = cmsys::RegularExpression::end((RegularExpression *)&regexString);
        uVar7 = std::__cxx11::string::size();
        if (sVar6 < uVar7) {
          cmsys::RegularExpression::end((RegularExpression *)&regexString);
          std::__cxx11::string::substr((ulong)((long)&makefileName.field_2 + 8),(ulong)local_298);
          std::__cxx11::string::operator=
                    ((string *)local_298,(string *)(makefileName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(makefileName.field_2._M_local_buf + 8));
        }
        else {
          std::__cxx11::string::clear();
        }
      }
      std::__cxx11::string::~string((string *)local_298);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&regexString);
      std::__cxx11::string::~string((string *)&flagRegex.progsize);
      std::__cxx11::string::~string((string *)(includesString.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(definesString.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
  }
  std::__cxx11::string::string((string *)local_360);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&local_380);
  bVar1 = std::operator==(&local_380,"Ninja");
  std::__cxx11::string::~string((string *)&local_380);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_360,"build.ninja");
  }
  else {
    std::__cxx11::string::operator=((string *)local_360,"Makefile");
  }
  if ((sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::operator<<((ostream *)fout,",\n\t");
  }
  poVar8 = std::operator<<((ostream *)fout,"\t{\n\t\t\t\"name\": \"");
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_3a0,lg);
  poVar8 = std::operator<<(poVar8,(string *)&local_3a0);
  poVar8 = std::operator<<(poVar8," - ");
  poVar8 = std::operator<<(poVar8,(string *)targetName);
  std::operator<<(poVar8,"\",\n");
  std::__cxx11::string::~string((string *)&local_3a0);
  poVar8 = std::operator<<((ostream *)fout,"\t\t\t\"cmd\": [");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,make,&local_3e1);
  BuildMakeCommand(&local_3c0,this,&local_3e0,(string *)local_360,targetName);
  poVar8 = std::operator<<(poVar8,(string *)&local_3c0);
  std::operator<<(poVar8,"],\n");
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::operator<<((ostream *)fout,"\t\t\t\"working_dir\": \"${project_path}\",\n");
  std::operator<<((ostream *)fout,
                  "\t\t\t\"file_regex\": \"^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)\"\n"
                 );
  std::operator<<((ostream *)fout,"\t\t}");
  std::__cxx11::string::~string((string *)local_360);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::AppendTarget(
  cmGeneratedFileStream& fout, const std::string& targetName,
  cmLocalGenerator* lg, cmGeneratorTarget* target, const char* make,
  const cmMakefile* makefile, const char* /*compiler*/,
  MapSourceFileFlags& sourceFileFlags, bool firstTarget)
{

  if (target != nullptr) {
    std::vector<cmSourceFile*> sourceFiles;
    target->GetSourceFiles(sourceFiles,
                           makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    for (cmSourceFile* sourceFile : sourceFiles) {
      auto sourceFileFlagsIter =
        sourceFileFlags.find(sourceFile->ResolveFullPath());
      if (sourceFileFlagsIter == sourceFileFlags.end()) {
        sourceFileFlagsIter =
          sourceFileFlags
            .insert(MapSourceFileFlags::value_type(
              sourceFile->ResolveFullPath(), std::vector<std::string>()))
            .first;
      }
      std::vector<std::string>& flags = sourceFileFlagsIter->second;
      std::string flagsString =
        this->ComputeFlagsForObject(sourceFile, lg, target);
      std::string definesString = this->ComputeDefines(sourceFile, lg, target);
      std::string includesString =
        this->ComputeIncludes(sourceFile, lg, target);
      flags.clear();
      cmsys::RegularExpression flagRegex;
      // Regular expression to extract compiler flags from a string
      // https://gist.github.com/3944250
      const char* regexString =
        R"((^|[ ])-[DIOUWfgs][^= ]+(=\"[^"]+\"|=[^"][^ ]+)?)";
      flagRegex.compile(regexString);
      std::string workString =
        cmStrCat(flagsString, " ", definesString, " ", includesString);
      while (flagRegex.find(workString)) {
        std::string::size_type start = flagRegex.start();
        if (workString[start] == ' ') {
          start++;
        }
        flags.push_back(workString.substr(start, flagRegex.end() - start));
        if (flagRegex.end() < workString.size()) {
          workString = workString.substr(flagRegex.end());
        } else {
          workString.clear();
        }
      }
    }
  }

  // Ninja uses ninja.build files (look for a way to get the output file name
  // from cmMakefile or something)
  std::string makefileName;
  if (this->GlobalGenerator->GetName() == "Ninja") {
    makefileName = "build.ninja";
  } else {
    makefileName = "Makefile";
  }
  if (!firstTarget) {
    fout << ",\n\t";
  }
  fout << "\t{\n\t\t\t\"name\": \"" << lg->GetProjectName() << " - "
       << targetName << "\",\n";
  fout << "\t\t\t\"cmd\": ["
       << this->BuildMakeCommand(make, makefileName, targetName) << "],\n";
  fout << "\t\t\t\"working_dir\": \"${project_path}\",\n";
  fout << "\t\t\t\"file_regex\": \""
          "^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)"
          "\"\n";
  fout << "\t\t}";
}